

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O0

st_quicly_sent_block_t * quicly_sentmap__new_block(quicly_sentmap_t *map)

{
  undefined8 *in_RDI;
  st_quicly_sent_block_t *block;
  st_quicly_sent_block_t *local_8;
  
  local_8 = (st_quicly_sent_block_t *)malloc(0x218);
  if (local_8 == (st_quicly_sent_block_t *)0x0) {
    local_8 = (st_quicly_sent_block_t *)0x0;
  }
  else {
    local_8->next = (st_quicly_sent_block_t *)0x0;
    local_8->num_entries = 0;
    local_8->next_insert_at = 0;
    if (in_RDI[1] == 0) {
      in_RDI[1] = local_8;
      *in_RDI = local_8;
    }
    else {
      *(st_quicly_sent_block_t **)in_RDI[1] = local_8;
      in_RDI[1] = local_8;
    }
  }
  return local_8;
}

Assistant:

struct st_quicly_sent_block_t *quicly_sentmap__new_block(quicly_sentmap_t *map)
{
    struct st_quicly_sent_block_t *block;

    if ((block = malloc(sizeof(*block))) == NULL)
        return NULL;

    block->next = NULL;
    block->num_entries = 0;
    block->next_insert_at = 0;
    if (map->tail != NULL) {
        map->tail->next = block;
        map->tail = block;
    } else {
        map->head = map->tail = block;
    }

    return block;
}